

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int handle_max_streams_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state,int uni)

{
  int iVar1;
  uint64_t count;
  st_quicly_max_streams_t *m;
  
  count = ptls_decode_quicint(&state->src,state->end);
  iVar1 = 0x20007;
  if (count < 0x1000000000000001) {
    m = &(conn->egress).max_streams.uni;
    if (uni == 0) {
      m = &(conn->egress).max_streams.bidi;
    }
    iVar1 = update_max_streams(m,count);
    if (iVar1 == 0) {
      open_blocked_streams(conn,uni);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int handle_max_streams_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state, int uni)
{
    quicly_max_streams_frame_t frame;
    int ret;

    if ((ret = quicly_decode_max_streams_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(MAX_STREAMS_RECEIVE, conn, conn->stash.now, frame.count, uni);

    if ((ret = update_max_streams(uni ? &conn->egress.max_streams.uni : &conn->egress.max_streams.bidi, frame.count)) != 0)
        return ret;

    open_blocked_streams(conn, uni);

    return 0;
}